

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O3

void __thiscall
Array_sub_ranges_by_range_Test::~Array_sub_ranges_by_range_Test
          (Array_sub_ranges_by_range_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Array, sub_ranges_by_range) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that a view of a subrange works
    by_value array1(10);
    for(int i=0; i<10; i++)
        array1[i] = double(i);

    Range range1(5,10);
    auto view1 = array1(range1);
    EXPECT_EQ(view1.size(), 5);
    EXPECT_EQ(array1.data()+5, view1.data());

    // create a copy of the data in a view
    // should contain a copy of the second half of array1
    by_value array2(view1);
    EXPECT_NE(view1.data(), array2.data());
    EXPECT_EQ(view1.size(), array2.size());
    auto it1 = array1.data()+5;
    auto it2 = array2.data()+5;
    while(it2!=array2.data()+array2.size()) {
        EXPECT_EQ(*it1, *it2);
        ++it2;
        ++it1;
    }
}